

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O1

void * dropt_safe_realloc(void *p,size_t numElements,size_t elementSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  
  if (numElements == 0 || elementSize == 0) {
    free(p);
    if (elementSize == 0) {
      __assert_fail("elementSize != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                    ,0x95,"void *dropt_safe_realloc(void *, size_t, size_t)");
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = elementSize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = numElements;
    if (SUB168(auVar1 * auVar2,8) == 0) {
      pvVar3 = realloc(p,SUB168(auVar1 * auVar2,0));
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void*
dropt_safe_realloc(void* p, size_t numElements, size_t elementSize)
{
    size_t numBytes;

    /* `elementSize` shouldn't legally be 0, but we check for it in case a
     * caller got the argument order wrong.
     */
    if (numElements == 0 || elementSize == 0)
    {
        /* The behavior of `realloc(p, 0)` is implementation-defined.  Let's
         * enforce a particular behavior.
         */
        free(p);

        assert(elementSize != 0);
        return NULL;
    }

    numBytes = numElements * elementSize;
    if (numBytes / elementSize != numElements)
    {
        /* Overflow. */
        return NULL;
    }

    return realloc(p, numBytes);
}